

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

bool __thiscall Application::CanOpenDocument(Application *this,char *name)

{
  ostream *poVar1;
  char *name_local;
  Application *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Checking whether we can open document ");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return true;
}

Assistant:

bool Application::CanOpenDocument(const char* name) {
    std::cout << "Checking whether we can open document " << name << "." << std::endl;
    return true;
}